

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O1

void __thiscall NaPNDelay::print_status(NaPNDelay *this)

{
  NaPetriCnInput *this_00;
  NaVector *this_01;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  NaPetriNet *this_02;
  char *pcVar6;
  char *pcVar7;
  NaVector *pNVar8;
  ulong uVar9;
  NaReal *pNVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  
  this_02 = NaPetriNode::net(&this->super_NaPetriNode);
  pcVar6 = NaPetriNet::name(this_02);
  pcVar7 = NaPetriNode::name(&this->super_NaPetriNode);
  NaPrintLog("NaPNDelay (%p, %s.%s):",this,pcVar6,pcVar7);
  NaPrintLog("  nMaxLag=%u,  nMinLag=%u\n",(ulong)this->nMaxLag,(ulong)this->nMinLag);
  NaPrintLog("  nActiveSleep=%u\n",(ulong)this->nActiveSleep);
  pcVar6 = "false";
  if (this->bAwaken != false) {
    pcVar6 = "true";
  }
  NaPrintLog("  bAwaken=%s\n",pcVar6);
  if (this->bSleepValue == false) {
    pcVar6 = "  bSleepValue=false\n";
  }
  else {
    if (this->bSleepValue1st != true) {
      NaPrintLog("  bSleepValue=true,  fSleepValue=%g\n",this->fSleepValue);
      goto LAB_0013d703;
    }
    pcVar6 = "  bSleepValue=true,  fSleepValue=(First)\n";
  }
  NaPrintLog(pcVar6);
LAB_0013d703:
  NaPrintLog("  delays map:");
  if (0 < this->nOutDim) {
    lVar13 = 0;
    do {
      NaPrintLog(" %u",(ulong)this->piOutMap[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->nOutDim);
  }
  NaPrintLog("\n");
  bVar1 = NaPetriNode::tunable(&this->super_NaPetriNode);
  if (!bVar1) {
    NaPrintLog("  delayed values in buffer:\n");
    this_01 = &this->vBuffer;
    uVar2 = NaVector::dim(this_01);
    this_00 = &this->in;
    pNVar8 = NaPetriCnInput::data(this_00);
    uVar3 = (*pNVar8->_vptr_NaVector[6])();
    if (uVar3 <= uVar2) {
      uVar2 = 0;
      do {
        uVar9 = (ulong)this->nOutDim;
        bVar1 = 0 < (long)uVar9;
        if ((long)uVar9 < 1) {
LAB_0013d80b:
          NaPrintLog("      ->");
        }
        else {
          if (*this->piOutMap == uVar2) {
            uVar11 = 0;
          }
          else {
            uVar12 = 0;
            do {
              if (uVar9 - 1 == uVar12) goto LAB_0013d80b;
              uVar11 = uVar12 + 1;
              lVar13 = uVar12 + 1;
              uVar12 = uVar11;
            } while (this->piOutMap[lVar13] != uVar2);
            bVar1 = uVar11 < uVar9;
          }
          if (!bVar1) goto LAB_0013d80b;
          NaPrintLog("  [%d] ->",(ulong)this->piOutMap[uVar11]);
        }
        pNVar8 = NaPetriCnInput::data(this_00);
        iVar4 = (*pNVar8->_vptr_NaVector[6])(pNVar8);
        if (iVar4 != 0) {
          uVar3 = 0;
          do {
            pNVar8 = NaPetriCnInput::data(this_00);
            iVar4 = (*pNVar8->_vptr_NaVector[6])(pNVar8);
            pNVar10 = NaVector::operator[](this_01,iVar4 * uVar2 + uVar3);
            NaPrintLog(" %g",*pNVar10);
            uVar3 = uVar3 + 1;
            pNVar8 = NaPetriCnInput::data(this_00);
            uVar5 = (*pNVar8->_vptr_NaVector[6])(pNVar8);
          } while (uVar3 < uVar5);
        }
        NaPrintLog("\n");
        uVar2 = uVar2 + 1;
        uVar3 = NaVector::dim(this_01);
        pNVar8 = NaPetriCnInput::data(this_00);
        uVar5 = (*pNVar8->_vptr_NaVector[6])();
      } while (uVar2 < uVar3 / uVar5);
    }
  }
  return;
}

Assistant:

void
NaPNDelay::print_status ()
{
  int	i, j;

  /* Print delay information anyway */
  NaPrintLog("NaPNDelay (%p, %s.%s):", this, net()->name(), name());
  NaPrintLog("  nMaxLag=%u,  nMinLag=%u\n", nMaxLag, nMinLag);
  NaPrintLog("  nActiveSleep=%u\n", nActiveSleep);
  NaPrintLog("  bAwaken=%s\n", bAwaken?"true":"false");
  if(!bSleepValue)
      NaPrintLog("  bSleepValue=false\n");
  else if(bSleepValue1st)
      NaPrintLog("  bSleepValue=true,  fSleepValue=(First)\n");
  else
      NaPrintLog("  bSleepValue=true,  fSleepValue=%g\n", fSleepValue);
  NaPrintLog("  delays map:");
  for(i = 0; i < nOutDim; ++i)
    NaPrintLog(" %u", piOutMap[i]);
  NaPrintLog("\n");

  if(!tunable()){
    /* Additional runtime info */
    NaPrintLog("  delayed values in buffer:\n");
    for(j = 0; j < vBuffer.dim() / in.data().dim(); ++j){
      for(i = 0; i < nOutDim; ++i)
	if(piOutMap[i] == j)
	  break;
      if(i < nOutDim)
	NaPrintLog("  [%d] ->", piOutMap[i]);
      else
	NaPrintLog("      ->");

      for(i = 0; i < in.data().dim(); ++i)
	NaPrintLog(" %g", vBuffer[j * in.data().dim() + i]);
      NaPrintLog("\n");
    }
  }
}